

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_3.cpp
# Opt level: O2

void __thiscall Date::add_day(Date *this,int n)

{
  undefined8 extraout_RAX;
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  if (n < 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"add_day() - negative argument passed",&local_31);
    error(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    _Unwind_Resume(extraout_RAX);
  }
  while (bVar1 = n != 0, n = n + -1, bVar1) {
    increment_day(this);
  }
  return;
}

Assistant:

void Date::add_day(int n)
{
	if (n <= 0)
		error("add_day() - negative argument passed");
	for (int i = 0; i < n; ++i)
		increment_day();
}